

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ImGuiTabBar *pIVar5;
  ImGuiPtrOrIndex *__src;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImGuiPtrOrIndex *__dest;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ImGuiTabBar *pIVar13;
  size_t __nmemb;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  bVar3 = pIVar4->SkipItems;
  if (bVar3 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar5 = (GImGui->TabBars).Buf.Data;
    iVar11 = -1;
    pIVar13 = tab_bar;
    if ((pIVar5 <= tab_bar) && (tab_bar < pIVar5 + (GImGui->TabBars).Buf.Size)) {
      iVar11 = (int)((ulong)((long)tab_bar - (long)pIVar5) >> 3) * 0x286bca1b;
      pIVar13 = (ImGuiTabBar *)0x0;
    }
    iVar8 = (pIVar7->CurrentTabBarStack).Size;
    if (iVar8 == (pIVar7->CurrentTabBarStack).Capacity) {
      if (iVar8 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar8 / 2 + iVar8;
      }
      iVar12 = iVar8 + 1;
      if (iVar8 + 1 < iVar9) {
        iVar12 = iVar9;
      }
      __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar12 << 4);
      __src = (pIVar7->CurrentTabBarStack).Data;
      if (__src != (ImGuiPtrOrIndex *)0x0) {
        memcpy(__dest,__src,(long)(pIVar7->CurrentTabBarStack).Size << 4);
        MemFree((pIVar7->CurrentTabBarStack).Data);
      }
      (pIVar7->CurrentTabBarStack).Data = __dest;
      (pIVar7->CurrentTabBarStack).Capacity = iVar12;
      iVar8 = (pIVar7->CurrentTabBarStack).Size;
    }
    else {
      __dest = (pIVar7->CurrentTabBarStack).Data;
    }
    __dest[iVar8].Ptr = pIVar13;
    __dest[iVar8].Index = iVar11;
    (pIVar7->CurrentTabBarStack).Size = (pIVar7->CurrentTabBarStack).Size + 1;
    pIVar7->CurrentTabBar = tab_bar;
    tab_bar->BackupCursorPos = (pIVar4->DC).CursorPos;
    iVar11 = tab_bar->CurrFrameVisible;
    if (iVar11 == pIVar7->FrameCount) {
      fVar1 = (tab_bar->BarRect).Max.y;
      fVar2 = tab_bar->ItemSpacingY;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar4->DC).CursorPos.y = fVar1 + fVar2;
      tab_bar->BeginCount = tab_bar->BeginCount + '\x01';
    }
    else {
      if ((((flags & 1U) != (tab_bar->Flags & 1U)) ||
          (((flags & 1U) == 0 && (tab_bar->TabsAddedNew != false)))) &&
         (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < (long)__nmemb)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x24,TabItemComparerByBeginOrder);
        iVar11 = tab_bar->CurrFrameVisible;
      }
      tab_bar->TabsAddedNew = false;
      uVar10 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar10 = flags;
      }
      tab_bar->Flags = uVar10;
      IVar6 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar6;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = iVar11;
      tab_bar->CurrFrameVisible = pIVar7->FrameCount;
      tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
      tab_bar->CurrTabsContentsHeight = 0.0;
      fVar1 = (pIVar7->Style).ItemSpacing.y;
      tab_bar->ItemSpacingY = fVar1;
      tab_bar->FramePadding = (pIVar7->Style).FramePadding;
      tab_bar->TabsActiveCount = 0;
      tab_bar->BeginCount = '\x01';
      fVar2 = (tab_bar->BarRect).Max.y;
      (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar4->DC).CursorPos.y = fVar1 + fVar2;
      GetColorU32((uint)((uVar10 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        if (tab_bar->Tabs.Size > 1)
            ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        //window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}